

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

Roaring64Map * roaring::Roaring64Map::fastunion(size_t n,Roaring64Map **inputs)

{
  bool bVar1;
  pointer ppVar2;
  const_reference pvVar3;
  long in_RDX;
  ulong in_RSI;
  Roaring64Map *in_RDI;
  roaring_bitmap_t *inner_result;
  Roaring *candidate_bitmap;
  uint candidate_key;
  const_iterator candidate_end_iter;
  const_iterator candidate_current_iter;
  uint group_key;
  vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
  group_bitmaps;
  roarings_t *roarings;
  size_t i;
  priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
  pq;
  anon_class_1_0_00000001 pq_comp;
  Roaring64Map *result;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_Roaring>_>::value,_iterator>
  in_stack_fffffffffffffe28;
  Roaring64Map *in_stack_fffffffffffffe30;
  const_iterator in_stack_fffffffffffffe38;
  priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
  *in_stack_fffffffffffffe40;
  value_type *in_stack_fffffffffffffe48;
  roaring_bitmap_t *in_stack_fffffffffffffe50;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe58;
  priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
  *in_stack_fffffffffffffe60;
  _Rb_tree_node_base local_160 [2];
  iterator local_108;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> local_100;
  roaring_bitmap_t *local_f8;
  _Base_ptr local_f0;
  _Base_ptr local_e8;
  Roaring *local_e0;
  Roaring *local_d8;
  uint local_cc;
  _Self local_c8;
  _Self local_c0;
  uint local_b8;
  undefined1 local_b1;
  undefined1 local_b0 [32];
  _Base_ptr local_90;
  _Self local_88;
  _Self local_80;
  undefined8 local_78;
  ulong local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_18;
  ulong local_10;
  
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<pq_entry,_std::allocator<pq_entry>_>::vector
            ((vector<pq_entry,_std::allocator<pq_entry>_> *)0x106365);
  std::
  priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
  ::priority_queue(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   (vector<pq_entry,_std::allocator<pq_entry>_> *)in_stack_fffffffffffffe50);
  std::vector<pq_entry,_std::allocator<pq_entry>_>::~vector(&in_stack_fffffffffffffe40->c);
  for (local_70 = 0; local_70 < local_10; local_70 = local_70 + 1) {
    local_78 = *(undefined8 *)(local_18 + local_70 * 8);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::begin(in_stack_fffffffffffffe28._M_node);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::end(in_stack_fffffffffffffe28._M_node);
    bVar1 = std::operator!=(&local_80,&local_88);
    if (bVar1) {
      local_b0._24_8_ =
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::begin((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                    *)in_stack_fffffffffffffe28._M_node);
      local_90 = (_Base_ptr)
                 std::
                 map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                 ::end(in_stack_fffffffffffffe28._M_node);
      std::
      priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
      ::push((priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
              *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
  }
  std::
  vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
  ::vector((vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
            *)0x1064be);
  local_b1 = 0;
  Roaring64Map(in_stack_fffffffffffffe30);
  do {
    bVar1 = std::
            priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
            ::empty((priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
                     *)0x1064dd);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_b1 = 1;
      std::
      vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
      ::~vector((vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
                 *)in_stack_fffffffffffffe40);
      std::
      priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
      ::~priority_queue((priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
                         *)0x1067ec);
      return in_RDI;
    }
    std::
    priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
    ::top((priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
           *)0x1064ff);
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *
                        )0x106510);
    local_b8 = ppVar2->first;
    std::
    vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
    ::clear((vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
             *)0x106526);
    while (bVar1 = std::
                   priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
                   ::empty((priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
                            *)0x106533), ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar3 = std::
               priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
               ::top((priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
                      *)0x106555);
      local_c0._M_node = (pvVar3->iterator)._M_node;
      pvVar3 = std::
               priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
               ::top((priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
                      *)0x106579);
      local_c8._M_node = (pvVar3->end)._M_node;
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
               operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>
                           *)0x10659e);
      local_cc = ppVar2->first;
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
               operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>
                           *)0x1065b4);
      local_d8 = &ppVar2->second;
      if (local_cc != local_b8) break;
      local_e0 = local_d8;
      std::
      vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
      ::push_back((vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
                   *)in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28._M_node);
      std::
      priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
      ::pop(in_stack_fffffffffffffe40);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                 in_stack_fffffffffffffe30);
      bVar1 = std::operator!=(&local_c0,&local_c8);
      if (bVar1) {
        local_f0 = local_c0._M_node;
        local_e8 = local_c8._M_node;
        std::
        priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/cpp/roaring64map.hh:1458:24)>
        ::push((priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
                *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      }
    }
    in_stack_fffffffffffffe40 =
         (priority_queue<pq_entry,_std::vector<pq_entry,_std::allocator<pq_entry>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_RoaringBitmap[P]CRoaring_cpp_roaring64map_hh:1458:24)>
          *)local_b0;
    in_stack_fffffffffffffe48 =
         (value_type *)
         std::
         vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
         ::size((vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
                 *)in_stack_fffffffffffffe40);
    std::
    vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
    ::data((vector<const_roaring::api::roaring_bitmap_s_*,_std::allocator<const_roaring::api::roaring_bitmap_s_*>_>
            *)0x1066ab);
    in_stack_fffffffffffffe50 =
         roaring_bitmap_or_many
                   ((size_t)in_stack_fffffffffffffe38._M_node,
                    (roaring_bitmap_t **)in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe30 = in_RDI;
    local_f8 = in_stack_fffffffffffffe50;
    local_108._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::end(in_stack_fffffffffffffe28._M_node);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
    _Rb_tree_const_iterator(&local_100,&local_108);
    in_stack_fffffffffffffe38._M_node = local_160;
    Roaring::Roaring((Roaring *)in_stack_fffffffffffffe30,
                     (roaring_bitmap_t *)in_stack_fffffffffffffe28._M_node);
    std::make_pair<unsigned_int&,roaring::Roaring>
              (&(in_stack_fffffffffffffe38._M_node)->_M_color,(Roaring *)in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe28 =
         std::
         map<unsigned_int,roaring::Roaring,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
         ::insert<std::pair<unsigned_int,roaring::Roaring>>
                   (&in_stack_fffffffffffffe30->roarings,in_stack_fffffffffffffe38,
                    in_stack_fffffffffffffe28._M_node);
    std::pair<unsigned_int,_roaring::Roaring>::~pair
              ((pair<unsigned_int,_roaring::Roaring> *)0x106764);
    Roaring::~Roaring((Roaring *)in_stack_fffffffffffffe30);
  } while( true );
}

Assistant:

static Roaring64Map fastunion(size_t n, const Roaring64Map **inputs) {
        // The strategy here is to basically do a "group by" operation.
        // We group the input roarings by key, do a 32-bit
        // roaring_bitmap_or_many on each group, and collect the results.
        // We accomplish the "group by" operation using a priority queue, which
        // tracks the next key for each of our input maps. At each step, our
        // algorithm takes the next subset of maps that share the same next key,
        // runs roaring_bitmap_or_many on those bitmaps, and then advances the
        // current_iter on all the affected entries and then repeats.

        // There is an entry in our priority queue for each of the 'n' inputs.
        // For a given Roaring64Map, we look at its underlying 'roarings'
        // std::map, and take its begin() and end(). This forms our half-open
        // interval [current_iter, end_iter), which we keep in the priority
        // queue as a pq_entry. These entries are updated (removed and then
        // reinserted with the pq_entry.iterator field advanced by one step) as
        // our algorithm progresses. But when a given interval becomes empty
        // (i.e. pq_entry.iterator == pq_entry.end) it is not returned to the
        // priority queue.
        struct pq_entry {
            roarings_t::const_iterator iterator;
            roarings_t::const_iterator end;
        };

        // Custom comparator for the priority queue.
        auto pq_comp = [](const pq_entry &lhs, const pq_entry &rhs) {
            auto left_key = lhs.iterator->first;
            auto right_key = rhs.iterator->first;

            // We compare in the opposite direction than normal because priority
            // queues normally order from largest to smallest, but we want
            // smallest to largest.
            return left_key > right_key;
        };

        // Create and populate the priority queue.
        std::priority_queue<pq_entry, std::vector<pq_entry>, decltype(pq_comp)>
            pq(pq_comp);
        for (size_t i = 0; i < n; ++i) {
            const auto &roarings = inputs[i]->roarings;
            if (roarings.begin() != roarings.end()) {
                pq.push({roarings.begin(), roarings.end()});
            }
        }

        // A reusable vector that holds the pointers to the inner bitmaps that
        // we pass to the underlying 32-bit fastunion operation.
        std::vector<const roaring_bitmap_t *> group_bitmaps;

        // Summary of the algorithm:
        // 1. While the priority queue is not empty:
        //    A. Get its lowest key. Call this group_key
        //    B. While the lowest entry in the priority queue has a key equal to
        //       group_key:
        //       1. Remove this entry (the pair {current_iter, end_iter}) from
        //          the priority queue.
        //       2. Add the bitmap pointed to by current_iter to a list of
        //          32-bit bitmaps to process.
        //       3. Advance current_iter. Now it will point to a bitmap entry
        //          with some key greater than group_key (or it will point to
        //          end()).
        //       4. If current_iter != end_iter, reinsert the pair into the
        //          priority queue.
        //    C. Invoke the 32-bit roaring_bitmap_or_many() and add to result
        Roaring64Map result;
        while (!pq.empty()) {
            // Find the next key (the lowest key) in the priority queue.
            auto group_key = pq.top().iterator->first;

            // The purpose of the inner loop is to gather all the inner bitmaps
            // that share "group_key" into "group_bitmaps" so that they can be
            // fed to roaring_bitmap_or_many(). While we are doing this, we
            // advance those iterators to their next value and reinsert them
            // into the priority queue (unless they reach their end).
            group_bitmaps.clear();
            while (!pq.empty()) {
                auto candidate_current_iter = pq.top().iterator;
                auto candidate_end_iter = pq.top().end;

                auto candidate_key = candidate_current_iter->first;
                const auto &candidate_bitmap = candidate_current_iter->second;

                // This element will either be in the group (having
                // key == group_key) or it will not be in the group (having
                // key > group_key). (Note it cannot have key < group_key
                // because of the ordered nature of the priority queue itself
                // and the ordered nature of all the underlying roaring maps).
                if (candidate_key != group_key) {
                    // This entry, and (thanks to the nature of the priority
                    // queue) all other entries as well, are all greater than
                    // group_key, so we're done collecting elements for the
                    // current group. Because of the way this loop was written,
                    // the group will will always contain at least one element.
                    break;
                }

                group_bitmaps.push_back(&candidate_bitmap.roaring);
                // Remove this entry from the priority queue. Note this
                // invalidates pq.top() so make sure you don't have any dangling
                // references to it.
                pq.pop();

                // Advance 'candidate_current_iter' and insert a new entry
                // {candidate_current_iter, candidate_end_iter} into the
                // priority queue (unless it has reached its end).
                ++candidate_current_iter;
                if (candidate_current_iter != candidate_end_iter) {
                    pq.push({candidate_current_iter, candidate_end_iter});
                }
            }

            // Use the fast inner union to combine these.
            auto *inner_result = roaring_bitmap_or_many(group_bitmaps.size(),
                                                        group_bitmaps.data());
            // Insert the 32-bit result at end of the 'roarings' map of the
            // result we are building.
            result.roarings.insert(
                result.roarings.end(),
                std::make_pair(group_key, Roaring(inner_result)));
        }
        return result;
    }